

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest8::iterate(NegativeTest8 *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  char *description;
  int shader_stage;
  int iVar2;
  string local_40;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    iVar2 = 0;
    do {
      local_40._M_dataplus._M_p._0_4_ = iVar2;
      executeIteration(this,(_shader_stage *)&local_40);
      deinitIteration(this);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 5);
    bVar1 = this->m_has_test_passed == false;
    if (bVar1) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,
               description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult NegativeTest8::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all shader stages. For each iteration, iteration-specific shader stage
	 * will feature an invalid subroutine definition. Other shader stages will be assigned
	 * valid bodies. The test fails if a program built of such shaders links successfully.
	 */
	for (int shader_stage = static_cast<int>(Utils::SHADER_STAGE_FIRST);
		 shader_stage < static_cast<int>(Utils::SHADER_STAGE_COUNT); ++shader_stage)
	{
		executeIteration(static_cast<Utils::_shader_stage>(shader_stage));
		deinitIteration();
	} /* for (all shader stages) */

	/* All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}